

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O1

void __thiscall Assimp::StepExporter::WriteFile(StepExporter *this)

{
  undefined1 *this_00;
  aiVector3D *paVar1;
  _Rb_tree_header *p_Var2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  aiMesh *paVar11;
  aiFace *paVar12;
  uint *puVar13;
  aiColor4D *paVar14;
  int iVar15;
  mapped_type_conflict *pmVar16;
  tm *__tp;
  ostream *poVar17;
  size_t sVar18;
  mapped_type *pmVar19;
  aiVector3D *paVar20;
  _Base_ptr p_Var21;
  aiScene *paVar22;
  _Base_ptr p_Var23;
  long lVar24;
  _Rb_tree_header *p_Var25;
  _Base_ptr p_Var26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  VectorIndexUMap uniqueVerts;
  char date_str [20];
  time_t date;
  float local_f4;
  float local_f0;
  float local_ec;
  _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
  local_98;
  ulong local_68;
  key_type local_60;
  aiVector3D *local_58 [4];
  time_t local_38;
  
  *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) =
       *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) | 4;
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar30 = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar22 = this->mScene;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  if (paVar22->mNumMeshes != 0) {
    uVar28 = 0;
    uVar30 = 0;
    do {
      paVar11 = paVar22->mMeshes[uVar28];
      if ((ulong)paVar11->mNumFaces != 0) {
        lVar24 = 0;
        do {
          uVar30 = (ulong)((int)uVar30 +
                          (uint)(*(int *)((long)&paVar11->mFaces->mNumIndices + lVar24) == 3));
          lVar24 = lVar24 + 0x10;
        } while ((ulong)paVar11->mNumFaces << 4 != lVar24);
      }
      if (paVar11->mNumVertices != 0) {
        uVar29 = 0;
        do {
          local_58[0] = paVar11->mVertices + uVar29;
          p_Var21 = &local_98._M_impl.super__Rb_tree_header._M_header;
          for (p_Var23 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
              (_Rb_tree_header *)p_Var23 != (_Rb_tree_header *)0x0;
              p_Var23 = (&p_Var23->_M_left)[*(aiVector3D **)(p_Var23 + 1) < local_58[0]]) {
            if (*(aiVector3D **)(p_Var23 + 1) >= local_58[0]) {
              p_Var21 = p_Var23;
            }
          }
          p_Var2 = &local_98._M_impl.super__Rb_tree_header;
          p_Var25 = p_Var2;
          if (((_Rb_tree_header *)p_Var21 != p_Var2) &&
             (p_Var25 = (_Rb_tree_header *)p_Var21,
             local_58[0] < (aiVector3D *)((_Rb_tree_header *)p_Var21)->_M_node_count)) {
            p_Var25 = p_Var2;
          }
          if (p_Var25 == p_Var2) {
            pmVar16 = std::
                      map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                      ::operator[]((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                                    *)&local_98,local_58);
            *pmVar16 = -1;
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 < paVar11->mNumVertices);
      }
      uVar28 = uVar28 + 1;
      paVar22 = this->mScene;
    } while (uVar28 < paVar22->mNumMeshes);
  }
  local_38 = time((time_t *)0x0);
  __tp = localtime(&local_38);
  strftime((char *)local_58,0x14,"%Y-%m-%dT%H:%M:%S",__tp);
  this_00 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"ISO-10303-21",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"HEADER",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"FILE_DESCRIPTION((\'STEP AP214\'),\'1\')",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"FILE_NAME(\'",0xb);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,(this->mFile)._M_dataplus._M_p,
                       (this->mFile)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,".stp\',\'",7);
  sVar18 = strlen((char *)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)local_58,sVar18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar17,"\',(\' \'),(\' \'),\'Spatial InterOp 3D\',\' \',\' \')",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"FILE_SCHEMA((\'automotive_design\'))",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"ENDSEC",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"DATA",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#1=MECHANICAL_DESIGN_GEOMETRIC_PRESENTATION_REPRESENTATION(\' \',("
             ,0x40);
  iVar15 = (int)uVar30;
  if (0 < iVar15) {
    lVar24 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      if ((ulong)(iVar15 - 1) * 0x1e != lVar24) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
      }
      lVar24 = lVar24 + 0x1e;
    } while (uVar30 * 0x1e != lVar24);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"),#6)",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#2=PRODUCT_DEFINITION_CONTEXT(\'\',#7,\'design\')",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#3=APPLICATION_PROTOCOL_DEFINITION(\'INTERNATIONAL STANDARD\',\'automotive_design\',1994,#7)"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#4=PRODUCT_CATEGORY_RELATIONSHIP(\'NONE\',\'NONE\',#8,#9)",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#5=SHAPE_DEFINITION_REPRESENTATION(#10,#11)",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#6= (GEOMETRIC_REPRESENTATION_CONTEXT(3)GLOBAL_UNCERTAINTY_ASSIGNED_CONTEXT((#12))GLOBAL_UNIT_ASSIGNED_CONTEXT((#13,#14,#15))REPRESENTATION_CONTEXT(\'NONE\',\'WORKSPACE\'))"
             ,0xa8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#7=APPLICATION_CONTEXT(\' \')",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#8=PRODUCT_CATEGORY(\'part\',\'NONE\')",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#9=PRODUCT_RELATED_PRODUCT_CATEGORY(\'detail\',\' \',(#17))",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#10=PRODUCT_DEFINITION_SHAPE(\'NONE\',\'NONE\',#18)",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#11=MANIFOLD_SURFACE_SHAPE_REPRESENTATION(\'Root\',(#16,#19),#6)",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#12=UNCERTAINTY_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0E-006),#13,\'\',\'\')",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#13=(CONVERSION_BASED_UNIT(\'METRE\',#20)LENGTH_UNIT()NAMED_UNIT(#21))",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#14=(NAMED_UNIT(#22)PLANE_ANGLE_UNIT()SI_UNIT($,.RADIAN.))",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#15=(NAMED_UNIT(#22)SOLID_ANGLE_UNIT()SI_UNIT($,.STERADIAN.))",0x3d
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#16=SHELL_BASED_SURFACE_MODEL(\'Root\',(#29))",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#17=PRODUCT(\'Root\',\'Root\',\'Root\',(#23))",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#18=PRODUCT_DEFINITION(\'NONE\',\'NONE\',#24,#2)",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#19=AXIS2_PLACEMENT_3D(\'\',#25,#26,#27)",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#20=LENGTH_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0),#28)",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#21=DIMENSIONAL_EXPONENTS(1.0,0.0,0.0,0.0,0.0,0.0,0.0)",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#22=DIMENSIONAL_EXPONENTS(0.0,0.0,0.0,0.0,0.0,0.0,0.0)",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#23=PRODUCT_CONTEXT(\'\',#7,\'mechanical\')",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#24=PRODUCT_DEFINITION_FORMATION_WITH_SPECIFIED_SOURCE(\' \',\'NONE\',#17,.NOT_KNOWN.)"
             ,0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#25=CARTESIAN_POINT(\'\',(0.0,0.0,0.0))",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#26=DIRECTION(\'\',(0.0,0.0,1.0))",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#27=DIRECTION(\'\',(1.0,0.0,0.0))",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#28= (NAMED_UNIT(#21)LENGTH_UNIT()SI_UNIT(.MILLI.,.METRE.))",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#29=CLOSED_SHELL(\'\',(",0x15);
  if (0 < iVar15) {
    lVar24 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      if ((ulong)(iVar15 - 1) * 0x1e != lVar24) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
      }
      lVar24 = lVar24 + 0x1e;
    } while (uVar30 * 0x1e != lVar24);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"))",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  p_Var21 = (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->meshes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var21 == p_Var2) {
    iVar15 = 100;
  }
  else {
    iVar15 = 100;
    do {
      local_60 = *(key_type *)(p_Var21 + 1);
      paVar11 = this->mScene->mMeshes[*(uint *)&p_Var21[1]._M_parent];
      pmVar19 = std::
                map<const_aiNode_*,_aiMatrix4x4t<float>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
                ::operator[](&this->trafos,&local_60);
      if (paVar11->mNumVertices != 0) {
        uVar30 = 0;
        do {
          paVar20 = paVar11->mVertices + uVar30;
          p_Var23 = &local_98._M_impl.super__Rb_tree_header._M_header;
          for (p_Var26 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var26 != (_Base_ptr)0x0;
              p_Var26 = (&p_Var26->_M_left)[*(aiVector3D **)(p_Var26 + 1) < paVar20]) {
            if (*(aiVector3D **)(p_Var26 + 1) >= paVar20) {
              p_Var23 = p_Var26;
            }
          }
          p_Var25 = &local_98._M_impl.super__Rb_tree_header;
          p_Var26 = &p_Var25->_M_header;
          if (((_Rb_tree_header *)p_Var23 != p_Var25) &&
             (p_Var26 = p_Var23, paVar20 < *(aiVector3D **)(p_Var23 + 1))) {
            p_Var26 = &p_Var25->_M_header;
          }
          if (*(int *)&p_Var26[1]._M_parent < 0) {
            *(int *)&p_Var26[1]._M_parent = iVar15;
            fVar39 = paVar20->x;
            fVar32 = paVar20->y;
            fVar37 = pmVar19->a2;
            fVar3 = pmVar19->a1;
            fVar43 = paVar20->z;
            fVar4 = pmVar19->a3;
            fVar41 = pmVar19->a4;
            fVar36 = pmVar19->b2;
            fVar45 = pmVar19->b1;
            fVar31 = pmVar19->b3;
            fVar38 = pmVar19->b4;
            fVar42 = pmVar19->c2;
            fVar46 = pmVar19->c1;
            fVar33 = pmVar19->c3;
            fVar34 = pmVar19->c4;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,*(int *)&p_Var26[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=CARTESIAN_POINT(\'\',(",0x15);
            poVar17 = std::ostream::_M_insert<double>
                                ((double)(fVar4 * fVar43 + fVar3 * fVar39 + fVar37 * fVar32 + fVar41
                                         ));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>
                                ((double)(fVar31 * fVar43 + fVar45 * fVar39 + fVar36 * fVar32 +
                                         fVar38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>
                                ((double)(fVar43 * fVar33 + fVar39 * fVar46 + fVar32 * fVar42 +
                                         fVar34));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,*(int *)&p_Var26[1]._M_parent + 1)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=VERTEX_POINT(\'\',#",0x12);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,*(int *)&p_Var26[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            iVar15 = iVar15 + 2;
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 < paVar11->mNumVertices);
      }
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != p_Var2);
  }
  paVar22 = this->mScene;
  if (paVar22->mNumMeshes != 0) {
    uVar30 = 0;
    local_f0 = 0.8;
    local_ec = 0.8;
    local_f4 = 0.8;
    do {
      local_68 = uVar30;
      paVar11 = paVar22->mMeshes[uVar30];
      if (paVar11->mNumFaces != 0) {
        uVar30 = 0;
        do {
          paVar12 = paVar11->mFaces;
          if (paVar12[uVar30].mNumIndices == 3) {
            paVar20 = paVar11->mVertices;
            puVar13 = paVar12[uVar30].mIndices;
            uVar5 = *puVar13;
            uVar6 = puVar13[1];
            uVar7 = puVar13[2];
            fVar39 = paVar20[uVar6].x;
            fVar32 = paVar20[uVar6].y;
            fVar37 = paVar20[uVar5].x;
            fVar3 = paVar20[uVar5].y;
            fVar46 = fVar39 - fVar37;
            fVar38 = fVar32 - fVar3;
            fVar43 = paVar20[uVar6].z;
            fVar4 = paVar20[uVar5].z;
            fVar42 = fVar43 - fVar4;
            fVar41 = paVar20[uVar7].x;
            fVar36 = paVar20[uVar7].y;
            fVar45 = paVar20[uVar7].z;
            fVar31 = fVar42 * fVar42 + fVar46 * fVar46 + fVar38 * fVar38;
            if (fVar31 < 0.0) {
              fVar31 = sqrtf(fVar31);
            }
            else {
              fVar31 = SQRT(fVar31);
            }
            fVar39 = fVar41 - fVar39;
            fVar32 = fVar36 - fVar32;
            fVar43 = fVar45 - fVar43;
            fVar33 = fVar43 * fVar43 + fVar39 * fVar39 + fVar32 * fVar32;
            if (fVar33 < 0.0) {
              fVar33 = sqrtf(fVar33);
            }
            else {
              fVar33 = SQRT(fVar33);
            }
            fVar40 = fVar37 - fVar41;
            fVar34 = fVar3 - fVar36;
            fVar44 = fVar4 - fVar45;
            fVar35 = fVar44 * fVar44 + fVar40 * fVar40 + fVar34 * fVar34;
            if (fVar35 < 0.0) {
              fVar35 = sqrtf(fVar35);
            }
            else {
              fVar35 = SQRT(fVar35);
            }
            fVar41 = fVar41 - fVar37;
            fVar36 = fVar36 - fVar3;
            fVar45 = fVar45 - fVar4;
            fVar37 = fVar45 * fVar45 + fVar41 * fVar41 + fVar36 * fVar36;
            if (fVar37 < 0.0) {
              fVar37 = sqrtf(fVar37);
            }
            else {
              fVar37 = SQRT(fVar37);
            }
            paVar1 = paVar20 + uVar5;
            p_Var21 = &local_98._M_impl.super__Rb_tree_header._M_header;
            for (p_Var23 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var23 != (_Base_ptr)0x0;
                p_Var23 = (&p_Var23->_M_left)[*(aiVector3D **)(p_Var23 + 1) < paVar1]) {
              if (*(aiVector3D **)(p_Var23 + 1) >= paVar1) {
                p_Var21 = p_Var23;
              }
            }
            p_Var23 = &local_98._M_impl.super__Rb_tree_header._M_header;
            p_Var26 = p_Var23;
            if ((p_Var21 != p_Var23) && (p_Var26 = p_Var21, paVar1 < *(aiVector3D **)(p_Var21 + 1)))
            {
              p_Var26 = p_Var23;
            }
            paVar1 = paVar20 + uVar6;
            iVar8 = *(int *)&p_Var26[1]._M_parent;
            if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              p_Var23 = &local_98._M_impl.super__Rb_tree_header._M_header;
              p_Var21 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                if (*(aiVector3D **)(p_Var21 + 1) >= paVar1) {
                  p_Var23 = p_Var21;
                }
                p_Var21 = (&p_Var21->_M_left)[*(aiVector3D **)(p_Var21 + 1) < paVar1];
              } while (p_Var21 != (_Base_ptr)0x0);
            }
            p_Var21 = &local_98._M_impl.super__Rb_tree_header._M_header;
            p_Var26 = p_Var21;
            if ((p_Var23 != p_Var21) && (p_Var26 = p_Var23, paVar1 < *(aiVector3D **)(p_Var23 + 1)))
            {
              p_Var26 = p_Var21;
            }
            paVar20 = paVar20 + uVar7;
            iVar9 = *(int *)&p_Var26[1]._M_parent;
            if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              p_Var21 = &local_98._M_impl.super__Rb_tree_header._M_header;
              p_Var23 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                if (*(aiVector3D **)(p_Var23 + 1) >= paVar20) {
                  p_Var21 = p_Var23;
                }
                p_Var23 = (&p_Var23->_M_left)[*(aiVector3D **)(p_Var23 + 1) < paVar20];
              } while (p_Var23 != (_Base_ptr)0x0);
            }
            p_Var2 = &local_98._M_impl.super__Rb_tree_header;
            p_Var23 = &p_Var2->_M_header;
            if (((_Rb_tree_header *)p_Var21 != p_Var2) &&
               (p_Var23 = p_Var21, paVar20 < *(aiVector3D **)(p_Var21 + 1))) {
              p_Var23 = &p_Var2->_M_header;
            }
            iVar10 = *(int *)&p_Var23[1]._M_parent;
            paVar14 = paVar11->mColors[0];
            if ((paVar14 != (aiColor4D *)0x0) && (paVar11->mNumVertices != 0)) {
              puVar13 = paVar12[uVar30].mIndices;
              uVar5 = *puVar13;
              uVar6 = puVar13[1];
              uVar7 = puVar13[2];
              local_ec = (paVar14[uVar5].r + 0.0 + paVar14[uVar6].r + paVar14[uVar7].r) / 3.0;
              local_f0 = (paVar14[uVar5].g + 0.0 + paVar14[uVar6].g + paVar14[uVar7].g) / 3.0;
              local_f4 = (paVar14[uVar5].b + 0.0 + paVar14[uVar6].b + paVar14[uVar7].b) / 3.0;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=STYLED_ITEM(\'\',(#",0x12);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"),#",3);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=PRESENTATION_STYLE_ASSIGNMENT((#",0x21);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=SURFACE_STYLE_USAGE(.BOTH.,#",0x1d);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=SURFACE_SIDE_STYLE(\'\',(#",0x19);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=SURFACE_STYLE_FILL_AREA(#",0x1a);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=FILL_AREA_STYLE(\'\',(#",0x16);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=FILL_AREA_STYLE_COLOUR(\'\',#",0x1c);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=COLOUR_RGB(\'\',",0xf);
            poVar17 = std::ostream::_M_insert<double>((double)local_ec);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)local_f0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)local_f4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=FACE_SURFACE(\'\',(#",0x13)
            ;
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0xd);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"),#",3);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=PLANE(\'\',#",0xb);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=AXIS2_PLACEMENT_3D(\'\',#",0x18);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,", #",3);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0xb);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0xb);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=DIRECTION(\'\',(",0xf);
            fVar31 = 1.0 / fVar31;
            poVar17 = std::ostream::_M_insert<double>((double)(fVar46 * fVar31));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar38 * fVar31));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar42 * fVar31));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=DIRECTION(\'\',(",0xf);
            fVar37 = 1.0 / fVar37;
            poVar17 = std::ostream::_M_insert<double>((double)(fVar41 * fVar37));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar36 * fVar37));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar45 * fVar37));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0xd);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=FACE_BOUND(\'\',#",0x10);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=EDGE_LOOP(\'\',(#",0x10);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0xf);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0xf);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=ORIENTED_EDGE(\'\',*,*,#",0x17);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=ORIENTED_EDGE(\'\',*,*,#",0x17);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x11);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,"=ORIENTED_EDGE(\'\',*,*,#",0x17);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=EDGE_CURVE(\'\',#",0x10);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar8 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            iVar27 = iVar9 + 1;
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar27);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",.F.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=EDGE_CURVE(\'\',#",0x10);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar27);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            iVar27 = iVar10 + 1;
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar27);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=EDGE_CURVE(\'\',#",0x10);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar27);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar8 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=LINE(\'\',#",10);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=LINE(\'\',#",10);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=LINE(\'\',#",10);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",#",2);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x1a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=VECTOR(\'\',#",0xc);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x1b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",1.0)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=VECTOR(\'\',#",0xc);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x1c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",1.0)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x1a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=VECTOR(\'\',#",0xc);
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar15 + 0x1d);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",1.0)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x1b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=DIRECTION(\'\',(",0xf);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar46 * fVar31));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar38 * fVar31));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar42 * fVar31));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x1c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=DIRECTION(\'\',(",0xf);
            fVar33 = 1.0 / fVar33;
            poVar17 = std::ostream::_M_insert<double>((double)(fVar39 * fVar33));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar32 * fVar33));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar43 * fVar33));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar17 = (ostream *)std::ostream::operator<<(this_00,iVar15 + 0x1d);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=DIRECTION(\'\',(",0xf);
            fVar35 = 1.0 / fVar35;
            poVar17 = std::ostream::_M_insert<double>((double)(fVar40 * fVar35));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar34 * fVar35));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
            poVar17 = std::ostream::_M_insert<double>((double)(fVar44 * fVar35));
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            iVar15 = iVar15 + 0x1e;
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 < paVar11->mNumFaces);
      }
      uVar30 = local_68 + 1;
      paVar22 = this->mScene;
    } while (uVar30 < paVar22->mNumMeshes);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"ENDSEC",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"END-ISO-10303-21",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::
  _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
  ::~_Rb_tree(&local_98);
  return;
}

Assistant:

void StepExporter::WriteFile()
{
    // see http://shodhganga.inflibnet.ac.in:8080/jspui/bitstream/10603/14116/11/11_chapter%203.pdf
    // note, that all realnumber values must be comma separated in x files
    mOutput.setf(std::ios::fixed);
    // precision for double
    // see http://stackoverflow.com/questions/554063/how-do-i-print-a-double-value-with-full-precision-using-cout
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // standard color
    aiColor4D fColor;
    fColor.r = 0.8f;
    fColor.g = 0.8f;
    fColor.b = 0.8f;

    int ind = 100; // the start index to be used
    int faceEntryLen = 30; // number of entries for a triangle/face
    // prepare unique (count triangles and vertices)

    VectorIndexUMap uniqueVerts; // use a map to reduce find complexity to log(n)
    VectorIndexUMap::iterator it;
    int countFace = 0;

    for (unsigned int i=0; i<mScene->mNumMeshes; ++i)
    {
        aiMesh* mesh = mScene->mMeshes[i];
        for (unsigned int j=0; j<mesh->mNumFaces; ++j)
        {
            aiFace* face = &(mesh->mFaces[j]);

            if (face->mNumIndices == 3) countFace++;
        }
        for (unsigned int j=0; j<mesh->mNumVertices; ++j)
        {
            aiVector3D* v = &(mesh->mVertices[j]);
            it =uniqueVerts.find(v);
            if (it == uniqueVerts.end())
            {
                uniqueVerts[v] = -1; // first mark the vector as not transformed
            }
        }
    }

    static const unsigned int date_nb_chars = 20;
    char date_str[date_nb_chars];
    std::time_t date = std::time(NULL);
    std::strftime(date_str, date_nb_chars, "%Y-%m-%dT%H:%M:%S", std::localtime(&date));

    // write the header
    mOutput << "ISO-10303-21" << endstr;
    mOutput << "HEADER" << endstr;
    mOutput << "FILE_DESCRIPTION(('STEP AP214'),'1')" << endstr;
    mOutput << "FILE_NAME('" << mFile << ".stp','" << date_str << "',(' '),(' '),'Spatial InterOp 3D',' ',' ')" << endstr;
    mOutput << "FILE_SCHEMA(('automotive_design'))" << endstr;
    mOutput << "ENDSEC" << endstr;

    // write the top of data
    mOutput << "DATA" << endstr;
    mOutput << "#1=MECHANICAL_DESIGN_GEOMETRIC_PRESENTATION_REPRESENTATION(' ',(";
    for (int i=0; i<countFace; ++i)
    {
        mOutput << "#" << i*faceEntryLen + ind + 2*uniqueVerts.size();
        if (i!=countFace-1) mOutput << ",";
    }
    mOutput << "),#6)" << endstr;

    mOutput << "#2=PRODUCT_DEFINITION_CONTEXT('',#7,'design')" << endstr;
    mOutput << "#3=APPLICATION_PROTOCOL_DEFINITION('INTERNATIONAL STANDARD','automotive_design',1994,#7)" << endstr;
    mOutput << "#4=PRODUCT_CATEGORY_RELATIONSHIP('NONE','NONE',#8,#9)" << endstr;
    mOutput << "#5=SHAPE_DEFINITION_REPRESENTATION(#10,#11)" << endstr;
    mOutput << "#6= (GEOMETRIC_REPRESENTATION_CONTEXT(3)GLOBAL_UNCERTAINTY_ASSIGNED_CONTEXT((#12))GLOBAL_UNIT_ASSIGNED_CONTEXT((#13,#14,#15))REPRESENTATION_CONTEXT('NONE','WORKSPACE'))" << endstr;
    mOutput << "#7=APPLICATION_CONTEXT(' ')" << endstr;
    mOutput << "#8=PRODUCT_CATEGORY('part','NONE')" << endstr;
    mOutput << "#9=PRODUCT_RELATED_PRODUCT_CATEGORY('detail',' ',(#17))" << endstr;
    mOutput << "#10=PRODUCT_DEFINITION_SHAPE('NONE','NONE',#18)" << endstr;
    mOutput << "#11=MANIFOLD_SURFACE_SHAPE_REPRESENTATION('Root',(#16,#19),#6)" << endstr;
    mOutput << "#12=UNCERTAINTY_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0E-006),#13,'','')" << endstr;
    mOutput << "#13=(CONVERSION_BASED_UNIT('METRE',#20)LENGTH_UNIT()NAMED_UNIT(#21))" << endstr;
    mOutput << "#14=(NAMED_UNIT(#22)PLANE_ANGLE_UNIT()SI_UNIT($,.RADIAN.))" << endstr;
    mOutput << "#15=(NAMED_UNIT(#22)SOLID_ANGLE_UNIT()SI_UNIT($,.STERADIAN.))" << endstr;
    mOutput << "#16=SHELL_BASED_SURFACE_MODEL('Root',(#29))" << endstr;
    mOutput << "#17=PRODUCT('Root','Root','Root',(#23))" << endstr;
    mOutput << "#18=PRODUCT_DEFINITION('NONE','NONE',#24,#2)" << endstr;
    mOutput << "#19=AXIS2_PLACEMENT_3D('',#25,#26,#27)" << endstr;
    mOutput << "#20=LENGTH_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0),#28)" << endstr;
    mOutput << "#21=DIMENSIONAL_EXPONENTS(1.0,0.0,0.0,0.0,0.0,0.0,0.0)" << endstr;
    mOutput << "#22=DIMENSIONAL_EXPONENTS(0.0,0.0,0.0,0.0,0.0,0.0,0.0)" << endstr;
    mOutput << "#23=PRODUCT_CONTEXT('',#7,'mechanical')" << endstr;
    mOutput << "#24=PRODUCT_DEFINITION_FORMATION_WITH_SPECIFIED_SOURCE(' ','NONE',#17,.NOT_KNOWN.)" << endstr;
    mOutput << "#25=CARTESIAN_POINT('',(0.0,0.0,0.0))" << endstr;
    mOutput << "#26=DIRECTION('',(0.0,0.0,1.0))" << endstr;
    mOutput << "#27=DIRECTION('',(1.0,0.0,0.0))" << endstr;
    mOutput << "#28= (NAMED_UNIT(#21)LENGTH_UNIT()SI_UNIT(.MILLI.,.METRE.))" << endstr;
    mOutput << "#29=CLOSED_SHELL('',(";
    for (int i=0; i<countFace; ++i)
    {
        mOutput << "#" << i*faceEntryLen + ind + 2*uniqueVerts.size() + 8;
        if (i!=countFace-1) mOutput << ",";
    }
    mOutput << "))" << endstr;

    // write all the unique transformed CARTESIAN and VERTEX
    for (MeshesByNodeMap::const_iterator it2 = meshes.begin(); it2 != meshes.end(); ++it2)
    {
        const aiNode& node = *(*it2).first;
        unsigned int mesh_idx = (*it2).second;

        const aiMesh* mesh = mScene->mMeshes[mesh_idx];
        aiMatrix4x4& trafo = trafos[&node];
        for (unsigned int i = 0; i < mesh->mNumVertices; ++i)
        {
            aiVector3D* v = &(mesh->mVertices[i]);
            it = uniqueVerts.find(v);
            if (it->second >=0 ) continue;
            it->second = ind; // this one is new, so set the index (ind)
            aiVector3D vt = trafo * (*v); // transform the coordinate
            mOutput << "#" << it->second << "=CARTESIAN_POINT('',(" << vt.x << "," << vt.y << "," << vt.z << "))" << endstr;
            mOutput << "#" << it->second+1 << "=VERTEX_POINT('',#" << it->second << ")" << endstr;
            ind += 2;
        }
    }

    // write the triangles
    for (unsigned int i=0; i<mScene->mNumMeshes; ++i)
    {
        aiMesh* mesh = mScene->mMeshes[i];
        for (unsigned int j=0; j<mesh->mNumFaces; ++j)
        {
            aiFace* face = &(mesh->mFaces[j]);

            if (face->mNumIndices != 3) continue;

            aiVector3D* v1 = &(mesh->mVertices[face->mIndices[0]]);
            aiVector3D* v2 = &(mesh->mVertices[face->mIndices[1]]);
            aiVector3D* v3 = &(mesh->mVertices[face->mIndices[2]]);
            aiVector3D dv12 = *v2 - *v1;
            aiVector3D dv23 = *v3 - *v2;
            aiVector3D dv31 = *v1 - *v3;
            aiVector3D dv13 = *v3 - *v1;
            dv12.Normalize();
            dv23.Normalize();
            dv31.Normalize();
            dv13.Normalize();

            int pid1 = uniqueVerts.find(v1)->second;
            int pid2 = uniqueVerts.find(v2)->second;
            int pid3 = uniqueVerts.find(v3)->second;

            // mean vertex color for the face if available
            if (mesh->HasVertexColors(0))
            {
                fColor.r = 0.0;
                fColor.g = 0.0;
                fColor.b = 0.0;
                fColor += mesh->mColors[0][face->mIndices[0]];
                fColor += mesh->mColors[0][face->mIndices[1]];
                fColor += mesh->mColors[0][face->mIndices[2]];
                fColor /= 3.0f;
            }

            int sid = ind; // the sub index
            mOutput << "#" << sid << "=STYLED_ITEM('',(#" << sid+1 << "),#" << sid+8 << ")" << endstr; /* the item that must be referenced in #1 */
            /* This is the color information of the Triangle */
            mOutput << "#" << sid+1 << "=PRESENTATION_STYLE_ASSIGNMENT((#" << sid+2 << "))" << endstr;
            mOutput << "#" << sid+2 << "=SURFACE_STYLE_USAGE(.BOTH.,#" << sid+3 << ")" << endstr;
            mOutput << "#" << sid+3 << "=SURFACE_SIDE_STYLE('',(#" << sid+4 << "))" << endstr;
            mOutput << "#" << sid+4 << "=SURFACE_STYLE_FILL_AREA(#" << sid+5 << ")" << endstr;
            mOutput << "#" << sid+5 << "=FILL_AREA_STYLE('',(#" << sid+6 << "))" << endstr;
            mOutput << "#" << sid+6 << "=FILL_AREA_STYLE_COLOUR('',#" << sid+7 << ")" << endstr;
            mOutput << "#" << sid+7 << "=COLOUR_RGB(''," << fColor.r << "," << fColor.g << "," << fColor.b << ")" << endstr;

            /* this is the geometry */
            mOutput << "#" << sid+8 << "=FACE_SURFACE('',(#" << sid+13 << "),#" << sid+9<< ",.T.)" << endstr; /* the face that must be referenced in 29 */

            /* 2 directions of the plane */
            mOutput << "#" << sid+9 << "=PLANE('',#" << sid+10 << ")" << endstr;
            mOutput << "#" << sid+10 << "=AXIS2_PLACEMENT_3D('',#" << pid1 << ", #" << sid+11 << ",#" << sid+12 << ")" << endstr;

            mOutput << "#" << sid+11 << "=DIRECTION('',(" << dv12.x << "," << dv12.y << "," << dv12.z << "))" << endstr;
            mOutput << "#" << sid+12 << "=DIRECTION('',(" << dv13.x << "," << dv13.y << "," << dv13.z << "))" << endstr;

            mOutput << "#" << sid+13 << "=FACE_BOUND('',#" << sid+14 << ",.T.)" << endstr;
            mOutput << "#" << sid+14 << "=EDGE_LOOP('',(#" << sid+15 << ",#" << sid+16 << ",#" << sid+17 << "))" << endstr;

            /* edge loop  */
            mOutput << "#" << sid+15 << "=ORIENTED_EDGE('',*,*,#" << sid+18 << ",.T.)" << endstr;
            mOutput << "#" << sid+16 << "=ORIENTED_EDGE('',*,*,#" << sid+19 << ",.T.)" << endstr;
            mOutput << "#" << sid+17 << "=ORIENTED_EDGE('',*,*,#" << sid+20 << ",.T.)" << endstr;

            /* oriented edges */
            mOutput << "#" << sid+18 << "=EDGE_CURVE('',#" << pid1+1 << ",#" << pid2+1 << ",#" << sid+21 << ",.F.)" << endstr;
            mOutput << "#" << sid+19 << "=EDGE_CURVE('',#" << pid2+1 << ",#" << pid3+1 << ",#" << sid+22 << ",.T.)" << endstr;
            mOutput << "#" << sid+20 << "=EDGE_CURVE('',#" << pid3+1 << ",#" << pid1+1 << ",#" << sid+23 << ",.T.)" << endstr;

            /* 3 lines and 3 vectors for the lines for the 3 edge curves */
            mOutput << "#" << sid+21 << "=LINE('',#" << pid1 << ",#" << sid+24 << ")" << endstr;
            mOutput << "#" << sid+22 << "=LINE('',#" << pid2 << ",#" << sid+25 << ")" << endstr;
            mOutput << "#" << sid+23 << "=LINE('',#" << pid3 << ",#" << sid+26 << ")" << endstr;
            mOutput << "#" << sid+24 << "=VECTOR('',#" << sid+27 << ",1.0)" << endstr;
            mOutput << "#" << sid+25 << "=VECTOR('',#" << sid+28 << ",1.0)" << endstr;
            mOutput << "#" << sid+26 << "=VECTOR('',#" << sid+29 << ",1.0)" << endstr;
            mOutput << "#" << sid+27 << "=DIRECTION('',(" << dv12.x << "," << dv12.y << "," << dv12.z << "))" << endstr;
            mOutput << "#" << sid+28 << "=DIRECTION('',(" << dv23.x << "," << dv23.y << "," << dv23.z << "))" << endstr;
            mOutput << "#" << sid+29 << "=DIRECTION('',(" << dv31.x << "," << dv31.y << "," << dv31.z << "))" << endstr;
            ind += faceEntryLen; // increase counter
        }
    }

    mOutput << "ENDSEC" << endstr; // end of data section
    mOutput << "END-ISO-10303-21" << endstr; // end of file
}